

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nosimd.h
# Opt level: O2

void nosimd::arithmetic::abs<signed_char>(char *pSrc,char *pDst,int len)

{
  ulong uVar1;
  int i;
  ulong uVar2;
  byte bVar3;
  
  uVar1 = 0;
  if (0 < len) {
    uVar1 = (ulong)(uint)len;
  }
  uVar2 = 0;
  if (pSrc == pDst) {
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      if (pDst[uVar2] < '\0') {
        pDst[uVar2] = -pDst[uVar2];
      }
    }
  }
  else {
    for (; uVar1 != uVar2; uVar2 = uVar2 + 1) {
      bVar3 = pSrc[uVar2] >> 7;
      pDst[uVar2] = (pSrc[uVar2] ^ bVar3) - bVar3;
    }
  }
  return;
}

Assistant:

inline void abs(const _T * pSrc, _T * pDst, int len)
        {
            if (pSrc == pDst)
            {
                for (int i = 0; i < len; ++i)
                    if (pDst[i] < 0)
                        pDst[i] = -pDst[i];
            }
            else
            {
                for (int i = 0; i < len; ++i)
                {
                    if (pSrc[i] >= 0)
                        pDst[i] = pSrc[i];
                    else
                        pDst[i] = -pSrc[i];
                }
            }
        }